

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  __ssize_t _Var2;
  char *pcVar3;
  FILE *in_RCX;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  Headers *__lineptr;
  stream_line_reader line_reader;
  char buf [2048];
  undefined1 local_868 [16];
  size_t local_858;
  char *local_850;
  _Alloc_hider local_848;
  char *local_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  char local_828 [2048];
  
  local_868._8_8_ = local_828;
  local_858 = 0x800;
  local_850 = (char *)0x0;
  local_848._M_p = (pointer)&local_838;
  local_840 = (char *)0x0;
  local_838._M_local_buf[0] = '\0';
  __lineptr = headers;
  local_868._0_8_ = strm;
  while( true ) {
    _Var2 = stream_line_reader::getline
                      ((stream_line_reader *)local_868,(char **)__lineptr,in_RDX,in_RCX);
    if ((char)_Var2 == '\0') break;
    bVar1 = stream_line_reader::end_with_crlf((stream_line_reader *)local_868);
    in_RDX = extraout_RDX;
    if (bVar1) {
      pcVar3 = local_840;
      if (local_840 == (char *)0x0) {
        pcVar3 = local_850;
      }
      if (pcVar3 == (char *)0x2) {
        bVar1 = true;
        goto LAB_0012c1cd;
      }
      if ((char *)0x2000 < pcVar3) break;
      in_RCX = (FILE *)&local_848;
      if (local_840 == (char *)0x0) {
        in_RCX = (FILE *)(local_868 + 8);
      }
      __lineptr = (Headers *)(*(char **)in_RCX + (long)pcVar3 + -2);
      parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                (*(char **)in_RCX,(char *)__lineptr,(anon_class_8_1_b2c1a266)headers);
      in_RDX = extraout_RDX_00;
    }
  }
  bVar1 = false;
LAB_0012c1cd:
  std::__cxx11::string::~string((string *)&local_848);
  return bVar1;
}

Assistant:

inline stream_line_reader::stream_line_reader(Stream &strm, char *fixed_buffer,
                                              size_t fixed_buffer_size)
    : strm_(strm), fixed_buffer_(fixed_buffer),
      fixed_buffer_size_(fixed_buffer_size) {}